

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmemmgr.c
# Opt level: O0

void do_sarray_io(j_common_ptr cinfo,jvirt_sarray_ptr ptr,boolean writing)

{
  uint uVar1;
  long lVar2;
  int in_EDX;
  long *in_RSI;
  undefined8 in_RDI;
  long i;
  long thisrow;
  long rows;
  long byte_count;
  long file_offset;
  long bytesperrow;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  long local_48;
  long local_28;
  
  uVar1 = *(uint *)((long)in_RSI + 0xc);
  local_28 = (ulong)*(uint *)((long)in_RSI + 0x1c) * (ulong)uVar1;
  local_48 = 0;
  while( true ) {
    if ((long)(ulong)*(uint *)((long)in_RSI + 0x14) <= local_48) {
      return;
    }
    if ((long)(ulong)*(uint *)(in_RSI + 3) <
        (long)((ulong)*(uint *)((long)in_RSI + 0x14) - local_48)) {
      local_50 = (ulong)*(uint *)(in_RSI + 3);
    }
    else {
      local_50 = (ulong)*(uint *)((long)in_RSI + 0x14) - local_48;
    }
    lVar2 = (ulong)*(uint *)((long)in_RSI + 0x1c) + local_48;
    if ((long)local_50 < (long)((ulong)*(uint *)(in_RSI + 4) - lVar2)) {
      local_58 = local_50;
    }
    else {
      local_58 = (ulong)*(uint *)(in_RSI + 4) - lVar2;
    }
    if ((long)local_58 < (long)((ulong)*(uint *)(in_RSI + 1) - lVar2)) {
      local_60 = local_58;
    }
    else {
      local_60 = (ulong)*(uint *)(in_RSI + 1) - lVar2;
    }
    if ((long)local_60 < 1) break;
    lVar2 = local_60 * uVar1;
    if (in_EDX == 0) {
      (*(code *)in_RSI[7])(in_RDI,in_RSI + 7,*(undefined8 *)(*in_RSI + local_48 * 8),local_28,lVar2)
      ;
    }
    else {
      (*(code *)in_RSI[8])(in_RDI,in_RSI + 7,*(undefined8 *)(*in_RSI + local_48 * 8),local_28,lVar2)
      ;
    }
    local_28 = lVar2 + local_28;
    local_48 = (ulong)*(uint *)(in_RSI + 3) + local_48;
  }
  return;
}

Assistant:

LOCAL(void)
do_sarray_io (j_common_ptr cinfo, jvirt_sarray_ptr ptr, boolean writing)
/* Do backing store read or write of a virtual sample array */
{
  long bytesperrow, file_offset, byte_count, rows, thisrow, i;

  bytesperrow = (long) ptr->samplesperrow * SIZEOF(JSAMPLE);
  file_offset = ptr->cur_start_row * bytesperrow;
  /* Loop to read or write each allocation chunk in mem_buffer */
  for (i = 0; i < (long) ptr->rows_in_mem; i += ptr->rowsperchunk) {
    /* One chunk, but check for short chunk at end of buffer */
    rows = MIN((long) ptr->rowsperchunk, (long) ptr->rows_in_mem - i);
    /* Transfer no more than is currently defined */
    thisrow = (long) ptr->cur_start_row + i;
    rows = MIN(rows, (long) ptr->first_undef_row - thisrow);
    /* Transfer no more than fits in file */
    rows = MIN(rows, (long) ptr->rows_in_array - thisrow);
    if (rows <= 0)		/* this chunk might be past end of file! */
      break;
    byte_count = rows * bytesperrow;
    if (writing)
      (*ptr->b_s_info.write_backing_store) (cinfo, & ptr->b_s_info,
					    (void FAR *) ptr->mem_buffer[i],
					    file_offset, byte_count);
    else
      (*ptr->b_s_info.read_backing_store) (cinfo, & ptr->b_s_info,
					   (void FAR *) ptr->mem_buffer[i],
					   file_offset, byte_count);
    file_offset += byte_count;
  }
}